

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O0

long __thiscall
libdivide::divider<long,_(libdivide::Branching)1>::recover
          (divider<long,_(libdivide::Branching)1> *this)

{
  byte bVar1;
  uint8_t shift;
  uint8_t more;
  uint64_t result_1;
  uint64_t local_80;
  divider<long,_(libdivide::Branching)1> *this_local;
  libdivide_s64_t den;
  uint64_t local_48;
  int64_t result;
  uint64_t q;
  uint64_t rem_ignored;
  uint64_t n_lo;
  uint64_t n_hi;
  uint64_t d;
  int magic_was_negated;
  int negative_divisor;
  uint64_t absD;
  
  bVar1 = (this->div).denom.more;
  if ((this->div).denom.magic == 0) {
    local_48 = 1L << (bVar1 & 0x3f);
    if ((bVar1 & 0x80) != 0) {
      local_48 = -local_48;
    }
    rem_ignored = local_48;
  }
  else {
    local_80 = 1;
    if ((bVar1 & 0x80) != 0) {
      local_80 = 0xffffffffffffffff;
    }
    rem_ignored = local_80;
  }
  return rem_ignored;
}

Assistant:

T recover() const { return div.recover(); }